

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O3

vector<ArFileEntry,_std::allocator<ArFileEntry>_> *
loadArArchive(vector<ArFileEntry,_std::allocator<ArFileEntry>_> *__return_storage_ptr__,
             path *inputName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ByteArray *pBVar2;
  char cVar3;
  size_type sVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t start;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ArFileEntry entry;
  ByteArray input;
  char fileName [17];
  value_type local_c8;
  ByteArray local_90;
  path local_78;
  string local_50;
  
  ByteArray::fromFile(&local_90,inputName,0,0);
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_90.size_ < 8) {
    if (local_90.size_ < 4) goto LAB_001729e7;
  }
  else if (*(long *)local_90.data_ == 0xa3e686372613c21) {
    if (local_90.size_ != 8) {
      uVar8 = 8;
      pBVar2 = &local_c8.data;
      sVar6 = local_90.size_;
      do {
        start = uVar8 + 0x3c;
        lVar9 = 0;
        iVar11 = 0;
        do {
          iVar10 = (int)*(char *)((long)local_90.data_ + lVar9 + uVar8 + 0x30);
          if (iVar10 == 0x20) break;
          iVar11 = iVar10 + iVar11 * 10 + -0x30;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 10);
        if (*(int *)((long)local_90.data_ + start) == 0x464c457f) {
          local_78._path.field_2._M_local_buf[0] = '\0';
          uVar5 = 0;
          do {
            cVar3 = *(char *)((long)local_90.data_ + uVar5 + uVar8);
            if (cVar3 == ' ') {
              if (uVar5 == 0) {
                uVar8 = 0;
              }
              else {
                uVar7 = (ulong)((int)uVar5 - 1);
                uVar8 = uVar5 & 0xffffffff;
                if (*(char *)((long)&local_78._path._M_dataplus._M_p + uVar7) == '/') {
                  uVar8 = uVar7;
                }
              }
              *(undefined1 *)((long)&local_78._path._M_dataplus._M_p + uVar8) = 0;
              break;
            }
            *(char *)((long)&local_78._path._M_dataplus._M_p + uVar5) = cVar3;
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0x10);
          local_c8.name._M_dataplus._M_p = (pointer)&local_c8.name.field_2;
          local_c8.name._M_string_length = 0;
          local_c8.name.field_2._M_local_buf[0] = '\0';
          ByteArray::ByteArray(pBVar2);
          sVar4 = local_c8.name._M_string_length;
          strlen((char *)&local_78);
          std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)sVar4,(ulong)&local_78);
          ByteArray::mid((ByteArray *)&local_50,&local_90,start,(long)iVar11);
          ByteArray::operator=(pBVar2,(ByteArray *)&local_50);
          ByteArray::~ByteArray((ByteArray *)&local_50);
          std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
                    (__return_storage_ptr__,&local_c8);
          ByteArray::~ByteArray(pBVar2);
          sVar6 = local_90.size_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.name._M_dataplus._M_p != &local_c8.name.field_2) {
            operator_delete(local_c8.name._M_dataplus._M_p,
                            CONCAT71(local_c8.name.field_2._M_allocated_capacity._1_7_,
                                     local_c8.name.field_2._M_local_buf[0]) + 1);
            sVar6 = local_90.size_;
          }
        }
        uVar8 = (ulong)((uint)(start + (long)iVar11) & 1) + start + (long)iVar11;
      } while (uVar8 < sVar6);
    }
    goto LAB_001729e7;
  }
  if (*(int *)local_90.data_ == 0x464c457f) {
    paVar1 = &local_c8.name.field_2;
    local_c8.name._M_string_length = 0;
    local_c8.name.field_2._M_local_buf[0] = '\0';
    pBVar2 = &local_c8.data;
    local_c8.name._M_dataplus._M_p = (pointer)paVar1;
    ByteArray::ByteArray(pBVar2);
    ghc::filesystem::path::filename(&local_78,inputName);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_50,&local_78);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ghc::filesystem::path::~path(&local_78);
    ByteArray::operator=(pBVar2,&local_90);
    std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
              (__return_storage_ptr__,&local_c8);
    ByteArray::~ByteArray(pBVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.name._M_dataplus._M_p,
                      CONCAT71(local_c8.name.field_2._M_allocated_capacity._1_7_,
                               local_c8.name.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_001729e7:
  ByteArray::~ByteArray(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ArFileEntry> loadArArchive(const fs::path& inputName)
{
	ByteArray input = ByteArray::fromFile(inputName);
	std::vector<ArFileEntry> result;

	if (input.size() < 8 || memcmp(input.data(),"!<arch>\n",8) != 0)
	{
		if (input.size() < 4 || memcmp(input.data(),"\x7F""ELF",4) != 0)
			return result;

		ArFileEntry entry;
		entry.name = inputName.filename().u8string();
		entry.data = input;
		result.push_back(entry);
		return result;
	}

	size_t pos = 8;
	while (pos < input.size())
	{
		ArFileHeader* header = (ArFileHeader*) input.data(pos);
		pos += sizeof(ArFileHeader);
		
		// get file size
		int size = 0;
		for (int i = 0; i < 10; i++)
		{
			if (header->fileSize[i] == ' ')
				break;

			size = size*10;
			size += (header->fileSize[i]-'0');
		}

		// only ELF files are actually interesting
		if (memcmp(input.data(pos),"\x7F""ELF",4) == 0)
		{
			// get file name
			char fileName[17];
			fileName[16] = 0;
			for (int i = 0; i < 16; i++)
			{
				if (header->fileName[i] == ' ')
				{
					// remove trailing slashes of file names
					if (i > 0 && fileName[i-1] == '/')
						i--;
					fileName[i] = 0;
					break;
				}

				fileName[i] = header->fileName[i];
			}
		
			ArFileEntry entry;
			entry.name = fileName;
			entry.data = input.mid(pos,size);
			result.push_back(entry);
		}

		pos += size;
		if (pos % 2)
			pos++;
	}

	return result;
}